

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509cset.cc
# Opt level: O2

int X509_REVOKED_set_revocationDate(X509_REVOKED *r,ASN1_TIME *tm)

{
  if (r != (X509_REVOKED *)0x0) {
    if (r->revocationDate != tm) {
      tm = ASN1_STRING_dup(tm);
      if (tm == (ASN1_STRING *)0x0) {
        tm = (ASN1_STRING *)0x0;
      }
      else {
        ASN1_TIME_free(r->revocationDate);
        r->revocationDate = tm;
      }
    }
    return (int)(tm != (ASN1_STRING *)0x0);
  }
  return 0;
}

Assistant:

int X509_REVOKED_set_revocationDate(X509_REVOKED *revoked,
                                    const ASN1_TIME *tm) {
  ASN1_TIME *in;

  if (revoked == NULL) {
    return 0;
  }
  in = revoked->revocationDate;
  if (in != tm) {
    in = ASN1_STRING_dup(tm);
    if (in != NULL) {
      ASN1_TIME_free(revoked->revocationDate);
      revoked->revocationDate = in;
    }
  }
  return in != NULL;
}